

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test::TestBody
          (Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
           *this)

{
  bool bVar1;
  char *pcVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_268;
  AssertionResult gtest_ar_1;
  ScriptWitness local_238;
  AssertionResult gtest_ar;
  ScriptWitness local_1a8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_188;
  Transaction tx;
  ScriptWitness local_130;
  ScriptWitness local_110;
  ScriptWitness local_f0;
  ScriptWitness local_d0;
  ScriptWitness local_b0;
  ScriptWitness local_90;
  ScriptWitness local_70;
  ScriptWitness local_50;
  ScriptWitness local_30;
  
  cfd::core::Transaction::Transaction(&tx,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_268,
                 "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f",
                 (allocator *)&local_238);
      cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&local_268);
      cfd::core::Transaction::AddTxIn((Txid *)&tx,(uint)&gtest_ar,0,(Script *)0xfffffffffffffffe);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_268);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x13e,
               "Expected: tx.AddTxIn( Txid( \"d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f\"), 0, 4294967294) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&gtest_ar,"1122334455667788",(allocator *)&local_238);
      cfd::core::ByteData::ByteData((ByteData *)&local_268,(string *)&gtest_ar);
      cfd::core::Transaction::AddScriptWitnessStack((uint)&local_30,(ByteData *)&tx);
      cfd::core::ScriptWitness::~ScriptWitness(&local_30);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x141,
               "Expected: tx.AddScriptWitnessStack(0, ByteData(\"1122334455667788\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,"1122334455667788990011223344556677889900",
                 (allocator *)&local_238);
      cfd::core::ByteData160::ByteData160((ByteData160 *)&local_268,(string *)&gtest_ar);
      cfd::core::Transaction::AddScriptWitnessStack((uint)&local_50,(ByteData160 *)&tx);
      cfd::core::ScriptWitness::~ScriptWitness(&local_50);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x144,
               "Expected: tx.AddScriptWitnessStack( 0, ByteData160(\"1122334455667788990011223344556677889900\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385",
                 (allocator *)&local_238);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_268,(string *)&gtest_ar);
      cfd::core::Transaction::AddScriptWitnessStack((uint)&local_70,(ByteData256 *)&tx);
      cfd::core::ScriptWitness::~ScriptWitness(&local_70);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x149,
               "Expected: tx.AddScriptWitnessStack( 0, ByteData256( \"90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&gtest_ar,"aaaa",(allocator *)&local_238);
    cfd::core::ByteData::ByteData((ByteData *)&local_268,(string *)&gtest_ar);
    cfd::core::Transaction::AddScriptWitnessStack((uint)&local_90,(ByteData *)&tx);
    cfd::core::ScriptWitness::~ScriptWitness(&local_90);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_268,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x14a,
             "Expected: tx.AddScriptWitnessStack(3, ByteData(\"aaaa\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  local_268._M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetScriptWitnessStackNum((uint)&tx);
  local_238._vptr_ScriptWitness._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetScriptWitnessStackNum(0)","3",(uint *)&local_268,
             (int *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_268);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_268);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Transaction::GetTxIn((uint)&gtest_ar);
  cfd::core::ScriptWitness::ScriptWitness(&local_238,&local_1a8);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()",
             "\"1122334455667788\"",
             (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_268._M_impl.super__Vector_impl_data._M_start._0_4_),
             "1122334455667788");
  std::__cxx11::string::~string((string *)&local_268);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_188);
  cfd::core::ScriptWitness::~ScriptWitness(&local_238);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x14f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Transaction::GetTxIn((uint)&gtest_ar);
  cfd::core::ScriptWitness::ScriptWitness(&local_238,&local_1a8);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str()",
             "\"1122334455667788990011223344556677889900\"",
             (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_268._M_impl.super__Vector_impl_data._M_start._0_4_),
             "1122334455667788990011223344556677889900");
  std::__cxx11::string::~string((string *)&local_268);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_188);
  cfd::core::ScriptWitness::~ScriptWitness(&local_238);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Transaction::GetTxIn((uint)&gtest_ar);
  cfd::core::ScriptWitness::ScriptWitness(&local_238,&local_1a8);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str()",
             "\"90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385\"",
             (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_268._M_impl.super__Vector_impl_data._M_start._0_4_),
             "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385");
  std::__cxx11::string::~string((string *)&local_268);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_188);
  cfd::core::ScriptWitness::~ScriptWitness(&local_238);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x155,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&gtest_ar,"ffff",(allocator *)&local_238);
      cfd::core::ByteData::ByteData((ByteData *)&local_268,(string *)&gtest_ar);
      cfd::core::Transaction::SetScriptWitnessStack((uint)&local_b0,(uint)&tx,(ByteData *)0x0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x158,
               "Expected: tx.SetScriptWitnessStack(0, 0, ByteData(\"ffff\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,"1111222233334444555566667777888899990000",
                 (allocator *)&local_238);
      cfd::core::ByteData160::ByteData160((ByteData160 *)&local_268,(string *)&gtest_ar);
      cfd::core::Transaction::SetScriptWitnessStack((uint)&local_d0,(uint)&tx,(ByteData160 *)0x0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_d0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x15b,
               "Expected: tx.SetScriptWitnessStack( 0, 1, ByteData160(\"1111222233334444555566667777888899990000\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "1111222233334444555566667777888899990000111122223333444455556666",
                 (allocator *)&local_238);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_268,(string *)&gtest_ar);
      cfd::core::Transaction::SetScriptWitnessStack((uint)&local_f0,(uint)&tx,(ByteData256 *)0x0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_f0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x161,
               "Expected: tx.SetScriptWitnessStack( 0, 2, ByteData256( \"1111222233334444555566667777888899990000111122223333444455556666\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&gtest_ar,"aaaa",(allocator *)&local_238);
    cfd::core::ByteData::ByteData((ByteData *)&local_268,(string *)&gtest_ar);
    cfd::core::Transaction::SetScriptWitnessStack((uint)&local_110,(uint)&tx,(ByteData *)0x2);
    cfd::core::ScriptWitness::~ScriptWitness(&local_110);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_268,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x162,
             "Expected: tx.SetScriptWitnessStack(2, 0, ByteData(\"aaaa\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&gtest_ar,"bbbb",(allocator *)&local_238);
    cfd::core::ByteData::ByteData((ByteData *)&local_268,(string *)&gtest_ar);
    cfd::core::Transaction::SetScriptWitnessStack((uint)&local_130,(uint)&tx,(ByteData *)0x0);
    cfd::core::ScriptWitness::~ScriptWitness(&local_130);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_268,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x163,
             "Expected: tx.SetScriptWitnessStack(0, 4, ByteData(\"bbbb\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  local_268._M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetScriptWitnessStackNum((uint)&tx);
  local_238._vptr_ScriptWitness._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetScriptWitnessStackNum(0)","3",(uint *)&local_268,
             (int *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_268);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x165,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_268);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Transaction::GetTxIn((uint)&gtest_ar);
  cfd::core::ScriptWitness::ScriptWitness(&local_238,&local_1a8);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()","\"ffff\"",
             (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_268._M_impl.super__Vector_impl_data._M_start._0_4_),"ffff");
  std::__cxx11::string::~string((string *)&local_268);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_188);
  cfd::core::ScriptWitness::~ScriptWitness(&local_238);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Transaction::GetTxIn((uint)&gtest_ar);
  cfd::core::ScriptWitness::ScriptWitness(&local_238,&local_1a8);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str()",
             "\"1111222233334444555566667777888899990000\"",
             (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_268._M_impl.super__Vector_impl_data._M_start._0_4_),
             "1111222233334444555566667777888899990000");
  std::__cxx11::string::~string((string *)&local_268);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_188);
  cfd::core::ScriptWitness::~ScriptWitness(&local_238);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Transaction::GetTxIn((uint)&gtest_ar);
  cfd::core::ScriptWitness::ScriptWitness(&local_238,&local_1a8);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str()",
             "\"1111222233334444555566667777888899990000111122223333444455556666\"",
             (char *)CONCAT44(local_268._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_268._M_impl.super__Vector_impl_data._M_start._0_4_),
             "1111222233334444555566667777888899990000111122223333444455556666");
  std::__cxx11::string::~string((string *)&local_268);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_188);
  cfd::core::ScriptWitness::~ScriptWitness(&local_238);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_268._M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetScriptWitnessStackNum((uint)&tx);
  local_238._vptr_ScriptWitness._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetScriptWitnessStackNum(0)","3",(uint *)&local_268,
             (int *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_268);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_268);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Transaction::RemoveScriptWitnessStackAll((uint)&tx);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_268,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x172,
             "Expected: tx.RemoveScriptWitnessStackAll(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  local_268._M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetScriptWitnessStackNum((uint)&tx);
  local_238._vptr_ScriptWitness._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetScriptWitnessStackNum(0)","3",(uint *)&local_268,
             (int *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_268);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x173,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_268);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll((uint)&tx);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x175,
               "Expected: tx.RemoveScriptWitnessStackAll(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_268._M_impl.super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetScriptWitnessStackNum((uint)&tx);
  local_238._vptr_ScriptWitness._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetScriptWitnessStackNum(0)","0",(uint *)&local_268,
             (int *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_268);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_268);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Transaction::~Transaction(&tx);
  return;
}

Assistant:

TEST(Transaction, AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll) {
  Transaction tx(exp_version, exp_locktime);
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f"),
          0, 4294967294));

  // AddScriptWitnessStack
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, ByteData("1122334455667788")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0, ByteData160("1122334455667788990011223344556677889900")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0,
          ByteData256(
              "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385")));
  EXPECT_THROW(tx.AddScriptWitnessStack(3, ByteData("aaaa")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "1122334455667788");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1122334455667788990011223344556677889900");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385");

  // SetScriptWitnessStack
  EXPECT_NO_THROW(tx.SetScriptWitnessStack(0, 0, ByteData("ffff")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0, 1, ByteData160("1111222233334444555566667777888899990000")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0,
          2,
          ByteData256(
              "1111222233334444555566667777888899990000111122223333444455556666")));
  EXPECT_THROW(tx.SetScriptWitnessStack(2, 0, ByteData("aaaa")), CfdException);
  EXPECT_THROW(tx.SetScriptWitnessStack(0, 4, ByteData("bbbb")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "ffff");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1111222233334444555566667777888899990000");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "1111222233334444555566667777888899990000111122223333444455556666");

  // RemoveScriptWitnessStackAll
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_THROW(tx.RemoveScriptWitnessStackAll(3), CfdException);
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);

  EXPECT_NO_THROW(tx.RemoveScriptWitnessStackAll(0));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
}